

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O0

void __thiscall opencollada::Dae::readFile(Dae *this,string *path)

{
  bool bVar1;
  undefined1 uVar2;
  _Ios_Openmode _Var3;
  XmlNodeSet *pXVar4;
  _Base_ptr p_Var5;
  istream *piVar6;
  XmlDoc *in_RDI;
  iterator iVar7;
  string buffer;
  stringstream ss;
  XmlNode IDREF_array;
  iterator __end1_13;
  iterator __begin1_13;
  XmlNodeSet *__range1_13;
  XmlNodeSet *IDREF_arrays;
  XmlAttribute source_1;
  XmlNode element_3;
  iterator __end1_12;
  iterator __begin1_12;
  XmlNodeSet *__range1_12;
  XmlNodeSet *elementsWithSourceFragment;
  XmlAttribute url_1;
  XmlNode element_2;
  iterator __end1_11;
  iterator __begin1_11;
  XmlNodeSet *__range1_11;
  XmlNodeSet *elementsWithUrl;
  XmlNode ref;
  iterator __end1_10;
  iterator __begin1_10;
  XmlNodeSet *__range1_10;
  XmlNodeSet *refs;
  XmlNode init_from;
  iterator __end1_9;
  iterator __begin1_9;
  XmlNodeSet *__range1_9;
  XmlNodeSet *init_froms;
  pair<const_opencollada::Uri,_opencollada::Dae> *uri_dae;
  iterator __end1_8;
  iterator __begin1_8;
  map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
  *__range1_8;
  XmlAttribute convex_hull_of;
  XmlNode convex_mesh;
  iterator __end1_7;
  iterator __begin1_7;
  XmlNodeSet *__range1_7;
  XmlNodeSet *convex_meshes;
  XmlAttribute parent;
  XmlNode instance_physics_model;
  iterator __end1_6;
  iterator __begin1_6;
  XmlNodeSet *__range1_6;
  XmlNodeSet *instance_physics_models;
  XmlAttribute target;
  XmlNode element_1;
  iterator __end1_5;
  iterator __begin1_5;
  XmlNodeSet *__range1_5;
  XmlNodeSet *elementsWithTarget;
  XmlNode skeleton;
  iterator __end1_4;
  iterator __begin1_4;
  XmlNodeSet *__range1_4;
  XmlNodeSet *skeletons;
  XmlAttribute camera_node;
  XmlNode render;
  iterator __end1_3;
  iterator __begin1_3;
  XmlNodeSet *__range1_3;
  XmlNodeSet *renders;
  XmlAttribute source;
  XmlNode element;
  iterator __end1_2;
  iterator __begin1_2;
  XmlNodeSet *__range1_2;
  XmlNodeSet *elementsWithSource;
  XmlAttribute proxy;
  XmlNode instance_node;
  iterator __end1_1;
  iterator __begin1_1;
  XmlNodeSet *__range1_1;
  XmlNodeSet *instance_nodes;
  XmlAttribute url;
  XmlNode instance;
  iterator __end1;
  iterator __begin1;
  XmlNodeSet *__range1;
  XmlNodeSet *instances;
  Uri *in_stack_ffffffffffffec58;
  Dae *in_stack_ffffffffffffec60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec68;
  undefined7 in_stack_ffffffffffffec70;
  undefined4 in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffec88;
  XmlAttribute *in_stack_ffffffffffffec98;
  Uri *in_stack_ffffffffffffecc8;
  string *in_stack_ffffffffffffecf8;
  string *in_stack_ffffffffffffeda0;
  XmlNode *in_stack_ffffffffffffeda8;
  string *in_stack_ffffffffffffee10;
  string *in_stack_ffffffffffffee18;
  Dae *this_00;
  string local_11a0 [32];
  string local_1180 [32];
  stringstream local_1160 [392];
  XmlNode local_fd8;
  xmlNodeSetPtr local_fd0;
  int local_fc8;
  iterator local_fc0;
  xmlNodeSetPtr local_fb0;
  undefined4 in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff05c;
  XmlDoc *in_stack_fffffffffffff060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  xmlNodePtr local_f68;
  XmlNodeSet *local_f60;
  string local_f58 [32];
  XmlAttribute local_f38;
  XmlNode local_f30;
  xmlNodeSetPtr local_f28;
  int local_f20;
  iterator local_f18;
  xmlNodeSetPtr local_f08;
  int local_f00;
  xmlNodeSetPtr local_ef8;
  int in_stack_fffffffffffff110;
  undefined4 in_stack_fffffffffffff114;
  size_t in_stack_fffffffffffff118;
  Dae *in_stack_fffffffffffff120;
  string local_ec0 [32];
  string local_ea0 [32];
  xmlNodePtr local_e80;
  XmlNodeSet *local_e78;
  string local_e70 [32];
  XmlAttribute local_e50;
  XmlNode local_e48;
  xmlNodeSetPtr local_e40;
  int local_e38;
  iterator local_e30;
  xmlNodeSetPtr local_e20;
  int local_e18;
  iterator local_e10;
  XmlNodeSet *local_e00;
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  xmlNodePtr local_d98;
  XmlNodeSet *local_d90;
  string local_d88 [32];
  XmlNode local_d68;
  xmlNodeSetPtr local_d60;
  int local_d58;
  iterator local_d50;
  xmlNodeSetPtr local_d40;
  int local_d38;
  iterator local_d30;
  XmlNodeSet *local_d20;
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  xmlNodePtr local_c38;
  XmlNodeSet *local_c30;
  string local_c28 [32];
  XmlNode local_c08;
  xmlNodeSetPtr local_c00;
  int local_bf8;
  iterator local_bf0;
  xmlNodeSetPtr local_be0;
  int local_bd8;
  iterator local_bd0;
  XmlNodeSet *local_bc0;
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  xmlNodePtr local_b58;
  XmlNodeSet *local_b50;
  string local_b48 [32];
  reference local_b28;
  _Self local_b20;
  _Self local_b18;
  xmlDocPtr *local_b10;
  string local_b08 [32];
  XmlAttribute local_ae8;
  XmlNode local_ae0;
  xmlNodeSetPtr local_ad8;
  int local_ad0;
  iterator local_ac8;
  xmlNodeSetPtr local_ab8;
  int local_ab0;
  iterator local_aa8;
  XmlNodeSet *local_a98;
  string local_a90 [32];
  xmlNodePtr local_a70;
  XmlNodeSet *local_a68;
  string local_a60 [32];
  XmlAttribute local_a40;
  XmlNode local_a38;
  xmlNodeSetPtr local_a30;
  int local_a28;
  iterator local_a20;
  xmlNodeSetPtr local_a10;
  int local_a08;
  iterator local_a00;
  XmlNodeSet *local_9f0;
  string local_9e8 [32];
  xmlNodePtr local_9c8;
  XmlNodeSet *local_9c0;
  string local_9b8 [32];
  XmlAttribute local_998;
  XmlNode local_990;
  xmlNodeSetPtr local_988;
  int local_980;
  iterator local_978;
  xmlNodeSetPtr local_968;
  int local_960;
  iterator local_958;
  XmlNodeSet *local_948;
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  xmlNodePtr local_8e0;
  XmlNodeSet *local_8d8;
  XmlNode local_8d0 [4];
  XmlNode local_8b0;
  xmlNodeSetPtr local_8a8;
  int local_8a0;
  iterator local_898;
  xmlNodeSetPtr local_888;
  int local_880;
  iterator local_878;
  XmlNodeSet *local_868;
  string local_860 [32];
  xmlNodePtr local_840;
  XmlNodeSet *local_838;
  string local_830 [39];
  allocator local_809;
  string local_808 [32];
  XmlAttribute local_7e8;
  XmlNode local_7e0;
  xmlNodeSetPtr local_7d8;
  int local_7d0;
  iterator local_7c8;
  xmlNodeSetPtr local_7b8;
  int local_7b0;
  iterator local_7a8;
  XmlNodeSet *local_798;
  string local_790 [32];
  xmlNodePtr local_770;
  XmlNodeSet *local_768;
  string local_760 [32];
  XmlAttribute local_740;
  XmlNode local_738;
  xmlNodeSetPtr local_730;
  int local_728;
  iterator local_720;
  xmlNodeSetPtr local_710;
  int local_708;
  iterator local_700;
  XmlNodeSet *local_6f0;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  xmlNodePtr local_648;
  XmlNodeSet *local_640;
  string local_638 [32];
  XmlAttribute local_618;
  XmlNode local_610;
  xmlNodeSetPtr local_608;
  int local_600;
  iterator local_5f8;
  xmlNodeSetPtr local_5e8;
  int local_5e0;
  iterator local_5d8;
  _Base_ptr local_5c8;
  undefined1 local_5c0 [80];
  undefined1 local_570 [16];
  xmlNodeSetPtr local_560;
  int local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_550;
  xmlNodeSetPtr local_540;
  int local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_530;
  XmlNodeSet *local_520;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  xmlNodePtr local_e8;
  XmlNodeSet *local_e0;
  
  Uri::FromNativePath(in_stack_ffffffffffffecf8);
  Uri::operator=((Uri *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  Uri::~Uri((Uri *)in_stack_ffffffffffffec60);
  XmlDoc::readFile(in_stack_fffffffffffff060,
                   (string *)CONCAT44(in_stack_fffffffffffff05c,in_stack_fffffffffffff058));
  bVar1 = XmlDoc::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    local_e8 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_108);
    ::std::__cxx11::string::~string(local_128);
    ::std::__cxx11::string::~string(local_148);
    ::std::__cxx11::string::~string(local_168);
    ::std::__cxx11::string::~string(local_188);
    ::std::__cxx11::string::~string(local_1a8);
    ::std::__cxx11::string::~string(local_1c8);
    ::std::__cxx11::string::~string(local_1e8);
    ::std::__cxx11::string::~string(local_208);
    ::std::__cxx11::string::~string(local_228);
    ::std::__cxx11::string::~string(local_248);
    ::std::__cxx11::string::~string(local_268);
    ::std::__cxx11::string::~string(local_288);
    ::std::__cxx11::string::~string(local_2a8);
    ::std::__cxx11::string::~string(local_2c8);
    ::std::__cxx11::string::~string(local_2e8);
    ::std::__cxx11::string::~string(local_308);
    ::std::__cxx11::string::~string(local_328);
    ::std::__cxx11::string::~string(local_348);
    ::std::__cxx11::string::~string(local_368);
    ::std::__cxx11::string::~string(local_388);
    ::std::__cxx11::string::~string(local_3a8);
    ::std::__cxx11::string::~string(local_3c8);
    ::std::__cxx11::string::~string(local_3e8);
    ::std::__cxx11::string::~string(local_408);
    ::std::__cxx11::string::~string(local_428);
    ::std::__cxx11::string::~string(local_448);
    ::std::__cxx11::string::~string(local_468);
    ::std::__cxx11::string::~string(local_488);
    ::std::__cxx11::string::~string(local_4a8);
    ::std::__cxx11::string::~string(local_4c8);
    ::std::__cxx11::string::~string(local_4e8);
    ::std::__cxx11::string::~string(local_508);
    local_520 = pXVar4;
    local_e0 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_540 = iVar7.mNodeSet;
    local_538 = iVar7.mIndex;
    local_530._M_allocated_capacity = (size_type)local_540;
    local_530._8_4_ = local_538;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_560 = iVar7.mNodeSet;
    local_558 = iVar7.mIndex;
    local_550._M_allocated_capacity = (size_type)local_560;
    local_550._8_4_ = local_558;
    while (bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&local_530,(iterator *)&local_550),
          bVar1) {
      local_570._8_8_ = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_570._0_8_ =
           XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                              (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool((XmlAttribute *)local_570);
      if (bVar1) {
        XmlNode::line((XmlNode *)(local_570 + 8));
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string((string *)(local_5c0 + 0x30));
      }
      XmlNodeSet::iterator::operator++((iterator *)&local_530);
    }
    local_5c0._32_8_ = XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    this_00 = (Dae *)local_5c0;
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    p_Var5 = (_Base_ptr)XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string((string *)local_5c0);
    local_5c8 = p_Var5;
    local_5c0._40_8_ = p_Var5;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_5e8 = iVar7.mNodeSet;
    local_5e0 = iVar7.mIndex;
    local_5d8.mNodeSet = local_5e8;
    local_5d8.mIndex = local_5e0;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_608 = iVar7.mNodeSet;
    local_600 = iVar7.mIndex;
    local_5f8.mNodeSet = local_608;
    local_5f8.mIndex = local_600;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_5d8,&local_5f8), bVar1) {
      local_610 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_618 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_618);
      if (bVar1) {
        in_stack_ffffffffffffee10 = (string *)XmlNode::line(&local_610);
        in_stack_ffffffffffffee18 = local_638;
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_638);
      }
      XmlNodeSet::iterator::operator++(&local_5d8);
    }
    local_648 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_668);
    ::std::__cxx11::string::~string(local_688);
    ::std::__cxx11::string::~string(local_6a8);
    ::std::__cxx11::string::~string(local_6c8);
    ::std::__cxx11::string::~string(local_6e8);
    local_6f0 = pXVar4;
    local_640 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_710 = iVar7.mNodeSet;
    local_708 = iVar7.mIndex;
    local_700.mNodeSet = local_710;
    local_700.mIndex = local_708;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_730 = iVar7.mNodeSet;
    local_728 = iVar7.mIndex;
    local_720.mNodeSet = local_730;
    local_720.mIndex = local_728;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_700,&local_720), bVar1) {
      local_738 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_740 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_740);
      if (bVar1) {
        XmlNode::line(&local_738);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_760);
      }
      XmlNodeSet::iterator::operator++(&local_700);
    }
    local_770 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_790);
    local_798 = pXVar4;
    local_768 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_7b8 = iVar7.mNodeSet;
    local_7b0 = iVar7.mIndex;
    local_7a8.mNodeSet = local_7b8;
    local_7a8.mIndex = local_7b0;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_7d8 = iVar7.mNodeSet;
    local_7d0 = iVar7.mIndex;
    local_7c8.mNodeSet = local_7d8;
    local_7c8.mIndex = local_7d0;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_7a8,&local_7c8), bVar1) {
      local_7e0 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_808,"camera_node",&local_809);
      local_7e8 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      ::std::__cxx11::string::~string(local_808);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_7e8);
      if (bVar1) {
        XmlNode::line(&local_7e0);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_830);
      }
      XmlNodeSet::iterator::operator++(&local_7a8);
    }
    local_840 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_860);
    local_868 = pXVar4;
    local_838 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_888 = iVar7.mNodeSet;
    local_880 = iVar7.mIndex;
    local_878.mNodeSet = local_888;
    local_878.mIndex = local_880;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_8a8 = iVar7.mNodeSet;
    local_8a0 = iVar7.mIndex;
    local_898.mNodeSet = local_8a8;
    local_898.mIndex = local_8a0;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_878,&local_898), bVar1) {
      local_8b0 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      in_stack_ffffffffffffeda0 = (string *)XmlNode::line(&local_8b0);
      in_stack_ffffffffffffeda8 = local_8d0;
      XmlNode::text_abi_cxx11_((XmlNode *)in_stack_ffffffffffffec98);
      onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                  (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
      ::std::__cxx11::string::~string((string *)local_8d0);
      XmlNodeSet::iterator::operator++(&local_878);
    }
    local_8e0 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_900);
    ::std::__cxx11::string::~string(local_920);
    ::std::__cxx11::string::~string(local_940);
    local_948 = pXVar4;
    local_8d8 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_968 = iVar7.mNodeSet;
    local_960 = iVar7.mIndex;
    local_958.mNodeSet = local_968;
    local_958.mIndex = local_960;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_988 = iVar7.mNodeSet;
    local_980 = iVar7.mIndex;
    local_978.mNodeSet = local_988;
    local_978.mIndex = local_980;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_958,&local_978), bVar1) {
      local_990 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_998 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_998);
      if (bVar1) {
        XmlNode::line(&local_990);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_9b8);
      }
      XmlNodeSet::iterator::operator++(&local_958);
    }
    local_9c8 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_9e8);
    local_9f0 = pXVar4;
    local_9c0 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_a10 = iVar7.mNodeSet;
    local_a08 = iVar7.mIndex;
    local_a00.mNodeSet = local_a10;
    local_a00.mIndex = local_a08;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_a30 = iVar7.mNodeSet;
    local_a28 = iVar7.mIndex;
    local_a20.mNodeSet = local_a30;
    local_a20.mIndex = local_a28;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_a00,&local_a20), bVar1) {
      local_a38 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_a40 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_a40);
      if (bVar1) {
        XmlNode::line(&local_a38);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_a60);
      }
      XmlNodeSet::iterator::operator++(&local_a00);
    }
    local_a70 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_a90);
    local_a98 = pXVar4;
    local_a68 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_ab8 = iVar7.mNodeSet;
    local_ab0 = iVar7.mIndex;
    local_aa8.mNodeSet = local_ab8;
    local_aa8.mIndex = local_ab0;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_ad8 = iVar7.mNodeSet;
    local_ad0 = iVar7.mIndex;
    local_ac8.mNodeSet = local_ad8;
    local_ac8.mIndex = local_ad0;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_aa8,&local_ac8), bVar1) {
      local_ae0 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_ae8 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_ae8);
      if (bVar1) {
        XmlNode::line(&local_ae0);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyDAEURI(in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                    (string *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
        ::std::__cxx11::string::~string(local_b08);
      }
      XmlNodeSet::iterator::operator++(&local_aa8);
    }
    local_b10 = &in_RDI[4].mDoc;
    local_b18._M_node =
         (_Base_ptr)
         ::std::
         map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
         ::begin((map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                  *)in_stack_ffffffffffffec58);
    local_b20._M_node =
         (_Base_ptr)
         ::std::
         map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
         ::end((map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                *)in_stack_ffffffffffffec58);
    while (bVar1 = ::std::operator!=(&local_b18,&local_b20), bVar1) {
      local_b28 = ::std::_Rb_tree_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>::
                  operator*((_Rb_tree_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>
                             *)0x1bff35);
      Uri::nativePath_abi_cxx11_(in_stack_ffffffffffffecc8);
      readExternalFile(in_stack_ffffffffffffec60,&in_stack_ffffffffffffec58->mUri);
      ::std::__cxx11::string::~string(local_b48);
      ::std::_Rb_tree_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_opencollada::Uri,_opencollada::Dae>_> *)
                 in_stack_ffffffffffffec60);
    }
    local_b58 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_b78);
    ::std::__cxx11::string::~string(local_b98);
    ::std::__cxx11::string::~string(local_bb8);
    local_bc0 = pXVar4;
    local_b50 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_be0 = iVar7.mNodeSet;
    local_bd8 = iVar7.mIndex;
    local_bd0.mNodeSet = local_be0;
    local_bd0.mIndex = local_bd8;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_c00 = iVar7.mNodeSet;
    local_bf8 = iVar7.mIndex;
    local_bf0.mNodeSet = local_c00;
    local_bf0.mIndex = local_bf8;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_bd0,&local_bf0), bVar1) {
      local_c08 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      XmlNode::line(&local_c08);
      XmlNode::text_abi_cxx11_((XmlNode *)in_stack_ffffffffffffec98);
      onAnyURI(this_00,(size_t)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
      ::std::__cxx11::string::~string(local_c28);
      XmlNodeSet::iterator::operator++(&local_bd0);
    }
    local_c38 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_c58);
    ::std::__cxx11::string::~string(local_c78);
    ::std::__cxx11::string::~string(local_c98);
    ::std::__cxx11::string::~string(local_cb8);
    ::std::__cxx11::string::~string(local_cd8);
    ::std::__cxx11::string::~string(local_cf8);
    ::std::__cxx11::string::~string(local_d18);
    local_d20 = pXVar4;
    local_c30 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_d40 = iVar7.mNodeSet;
    local_d38 = iVar7.mIndex;
    local_d30.mNodeSet = local_d40;
    local_d30.mIndex = local_d38;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_d60 = iVar7.mNodeSet;
    local_d58 = iVar7.mIndex;
    local_d50.mNodeSet = local_d60;
    local_d50.mIndex = local_d58;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_d30,&local_d50), bVar1) {
      local_d68 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      XmlNode::line(&local_d68);
      XmlNode::text_abi_cxx11_((XmlNode *)in_stack_ffffffffffffec98);
      onAnyURI(this_00,(size_t)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
      ::std::__cxx11::string::~string(local_d88);
      XmlNodeSet::iterator::operator++(&local_d30);
    }
    local_d98 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_db8);
    ::std::__cxx11::string::~string(local_dd8);
    ::std::__cxx11::string::~string(local_df8);
    local_e00 = pXVar4;
    local_d90 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_e20 = iVar7.mNodeSet;
    local_e18 = iVar7.mIndex;
    local_e10.mNodeSet = local_e20;
    local_e10.mIndex = local_e18;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_e40 = iVar7.mNodeSet;
    local_e38 = iVar7.mIndex;
    local_e30.mNodeSet = local_e40;
    local_e30.mIndex = local_e38;
    while (bVar1 = XmlNodeSet::iterator::operator!=(&local_e10,&local_e30), bVar1) {
      local_e48 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_e50 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_e50);
      if (bVar1) {
        XmlNode::line(&local_e48);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyURI(this_00,(size_t)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
        ::std::__cxx11::string::~string(local_e70);
      }
      XmlNodeSet::iterator::operator++(&local_e10);
    }
    local_e80 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(in_stack_ffffffffffffec88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    ::std::operator+(in_stack_ffffffffffffec68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffec60);
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string(local_ea0);
    ::std::__cxx11::string::~string(local_ec0);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffff120);
    local_e78 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_f08 = iVar7.mNodeSet;
    local_f00 = iVar7.mIndex;
    local_ef8 = local_f08;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_f28 = iVar7.mNodeSet;
    local_f20 = iVar7.mIndex;
    local_f18.mNodeSet = local_f28;
    local_f18.mIndex = local_f20;
    while (bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&local_ef8,&local_f18), bVar1) {
      local_f30 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      local_f38 = XmlNode::attribute((XmlNode *)in_stack_ffffffffffffec68,
                                     (string *)in_stack_ffffffffffffec60);
      bVar1 = XmlAttribute::operator_cast_to_bool(&local_f38);
      if (bVar1) {
        in_stack_ffffffffffffec98 = (XmlAttribute *)XmlNode::line(&local_f30);
        XmlAttribute::value_abi_cxx11_(in_stack_ffffffffffffec98);
        onAnyURI(this_00,(size_t)in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
        ::std::__cxx11::string::~string(local_f58);
      }
      XmlNodeSet::iterator::operator++((iterator *)&local_ef8);
    }
    local_f68 = (xmlNodePtr)XmlDoc::root((XmlDoc *)in_stack_ffffffffffffec58);
    ::std::operator+(&local_f88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80));
    pXVar4 = XmlNode::selectNodes(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
    ::std::__cxx11::string::~string((string *)&local_f88);
    local_f60 = pXVar4;
    iVar7 = XmlNodeSet::begin((XmlNodeSet *)in_stack_ffffffffffffec60);
    local_fb0 = iVar7.mNodeSet;
    iVar7 = XmlNodeSet::end((XmlNodeSet *)in_stack_ffffffffffffec58);
    local_fd0 = iVar7.mNodeSet;
    local_fc8 = iVar7.mIndex;
    local_fc0.mNodeSet = local_fd0;
    local_fc0.mIndex = local_fc8;
    while (bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&stack0xfffffffffffff060,&local_fc0)
          , bVar1) {
      local_fd8 = XmlNodeSet::iterator::operator*((iterator *)in_stack_ffffffffffffec68);
      XmlNode::text_abi_cxx11_((XmlNode *)in_stack_ffffffffffffec98);
      _Var3 = ::std::operator|(_S_out,_S_in);
      ::std::__cxx11::stringstream::stringstream(local_1160,local_1180,_Var3);
      ::std::__cxx11::string::~string(local_1180);
      ::std::__cxx11::string::string(local_11a0);
      while( true ) {
        piVar6 = ::std::operator>>((istream *)local_1160,local_11a0);
        uVar2 = ::std::ios::operator_cast_to_bool
                          ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
        if (!(bool)uVar2) break;
        __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &in_RDI[5].mXPathCache;
        in_stack_ffffffffffffec68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             XmlNode::line(&local_fd8);
        ::std::
        vector<std::tuple<unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string>>>
        ::emplace_back<unsigned_long,std::__cxx11::string&>
                  ((vector<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(uVar2,in_stack_ffffffffffffec70),
                   (unsigned_long *)in_stack_ffffffffffffec68,__args_1);
      }
      ::std::__cxx11::string::~string(local_11a0);
      ::std::__cxx11::stringstream::~stringstream(local_1160);
      XmlNodeSet::iterator::operator++((iterator *)&stack0xfffffffffffff060);
    }
  }
  return;
}

Assistant:

void Dae::readFile(const string & path)
	{
		mUri = Uri::FromNativePath(path);

		Super::readFile(path);

		if (!*this)
			return;

		// List referenced DAEs

		// InstanceWithExtra and other <instance_*> with "url" attribute
		const auto & instances = root().selectNodes(
			xpath_all + Strings::instance_animation +
			xpath_or_all + Strings::instance_camera +
			xpath_or_all + Strings::instance_controller +
			xpath_or_all + Strings::instance_effect +
			xpath_or_all + Strings::instance_force_field +
			xpath_or_all + Strings::instance_formula +
			xpath_or_all + Strings::instance_geometry +
			xpath_or_all + Strings::instance_image +
			xpath_or_all + Strings::instance_joint +
			xpath_or_all + Strings::instance_kinematics_model +
			xpath_or_all + Strings::instance_kinematics_scene +
			xpath_or_all + Strings::instance_light +
			xpath_or_all + Strings::instance_node +
			xpath_or_all + Strings::instance_physics_material +
			xpath_or_all + Strings::instance_physics_model +
			xpath_or_all + Strings::instance_physics_scene +
			xpath_or_all + Strings::instance_visual_scene
		);
		for (auto instance : instances)
			if (auto url = instance.attribute(Strings::url))
				onAnyDAEURI(instance.line(), url.value());

		// <instance_node>
		const auto & instance_nodes = root().selectNodes(xpath_all + Strings::instance_node);
		for (auto instance_node : instance_nodes)
		{
			if (auto proxy = instance_node.attribute(Strings::proxy))
				onAnyDAEURI(instance_node.line(), proxy.value());
		}

		// <accessor>
		// <skin>
		// <morph>
		const auto & elementsWithSource = root().selectNodes(
			xpath_all + Strings::accessor +
			xpath_or_all + Strings::skin +
			xpath_or_all + Strings::morph
		);
		for (auto element : elementsWithSource)
		{
			if (auto source = element.attribute(Strings::source))
				onAnyDAEURI(element.line(), source.value());
		}

		// <render>
		const auto & renders = root().selectNodes(xpath_all + Strings::render);
		for (auto render : renders)
		{
			if (auto camera_node = render.attribute("camera_node"))
				onAnyDAEURI(render.line(), camera_node.value());
		}

		// <skeleton>
		const auto & skeletons = root().selectNodes(xpath_all + Strings::skeleton);
		for (auto skeleton : skeletons)
		{
			onAnyDAEURI(skeleton.line(), skeleton.text());
		}

		// <instance_material>
		// <instance_rigid_body>
		const auto & elementsWithTarget = root().selectNodes(
			xpath_all + Strings::instance_material +
			xpath_or_all + Strings::instance_rigid_body
		);
		for (auto element : elementsWithTarget)
		{
			if (auto target = element.attribute(Strings::target))
				onAnyDAEURI(element.line(), target.value());
		}

		// <instance_physics_model>
		const auto & instance_physics_models = root().selectNodes(xpath_all + Strings::instance_physics_model);
		for (auto instance_physics_model : instance_physics_models)
		{
			if (auto parent = instance_physics_model.attribute(Strings::parent))
				onAnyDAEURI(instance_physics_model.line(),  parent.value());
		}

		// <convex_mesh>
		const auto & convex_meshes = root().selectNodes(xpath_all + Strings::convex_mesh);
		for (auto convex_mesh : convex_meshes)
		{
			if (auto convex_hull_of = convex_mesh.attribute(Strings::convex_hull_of))
				onAnyDAEURI(convex_mesh.line(), convex_hull_of.value());
		}

		// TODO
		// rigid_body attribute is an sid. Make sid check.

		// <ref_attachment>
		// <attachment>
		//auto attachments = root().selectNodes(
		//	xpath_all + Strings::attachment +
		//	xpath_or_all + Strings::ref_attachment
		//);
		//for (auto attachment : attachments)
		//{
		//	if (auto rigid_body = attachment.attribute(Strings::rigid_body))
		//		onAnyDAEURI(attachment.line(), rigid_body.value());
		//}

		// Load found DAE references
		for (auto & uri_dae : mExternalDAEs)
			uri_dae.second.readExternalFile(uri_dae.first.nativePath());

		// Look for additional xs:anyURI that are not DAE references:

		// <image>/<init_from>
		const auto & init_froms = root().selectNodes(xpath_all + Strings::image + xpath_child + Strings::init_from);
		for (auto init_from : init_froms)
		{
			onAnyURI(init_from.line(), init_from.text());
		}

		// <binary>/<ref>
		// <init_from>/<ref>
		const auto & refs = root().selectNodes(
			xpath_all + Strings::binary + xpath_child + Strings::ref +
			xpath_or_all + Strings::init_from + xpath_child + Strings::ref
		);
		for (auto ref : refs)
		{
			onAnyURI(ref.line(), ref.text());
		}

		// <include>
		// <profile_BRIDGE>
		const auto & elementsWithUrl = root().selectNodes(
			xpath_all + Strings::include +
			xpath_or_all + Strings::profile_BRIDGE
		);
		for (auto element : elementsWithUrl)
		{
			if (auto url = element.attribute(Strings::url))
				onAnyURI(element.line(), url.value());
		}

		// Ignore these anyURI:
		// <COLLADA>@base
		// <contributor>/<author_website>
		// <contributor>/<source_data>

		// Look for URI fragments:

		// <channel>
		// <input>
		const auto & elementsWithSourceFragment = root().selectNodes(
			xpath_all + Strings::channel +
			xpath_or_all + Strings::input
		);
		for (auto element : elementsWithSourceFragment)
		{
			if (auto source = element.attribute(Strings::source))
				//onURIFragment(element.line(), source.value());
				onAnyURI(element.line(), source.value());
		}

		// Look for IDREFs

		// <IDREF_array>
		const auto & IDREF_arrays = root().selectNodes(xpath_all + Strings::IDREF_array);
		for (auto IDREF_array : IDREF_arrays)
		{
			stringstream ss(IDREF_array.text());
			string buffer;
			while (ss >> buffer)
				mIDREFs.emplace_back(IDREF_array.line(), buffer);
		}
	}